

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

bool __thiscall
glcts::TessellationShaderInvarianceRule4Test::isVertexDefined
          (TessellationShaderInvarianceRule4Test *this,float *vertex_data,uint n_vertices,
          float *vertex_data_seeked,uint n_vertex_data_seeked_components)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  
  if (n_vertices == 0) {
    bVar1 = false;
  }
  else {
    uVar2 = 0;
    bVar3 = false;
    do {
      uVar4 = uVar2 & 0xffffffff;
      if ((((*vertex_data_seeked != vertex_data[uVar4]) ||
           (NAN(*vertex_data_seeked) || NAN(vertex_data[uVar4]))) ||
          (vertex_data_seeked[1] != vertex_data[uVar4 + 1])) ||
         (NAN(vertex_data_seeked[1]) || NAN(vertex_data[uVar4 + 1]))) {
LAB_00d3ad2f:
        bVar5 = false;
        bVar1 = bVar3;
      }
      else {
        bVar5 = true;
        bVar1 = true;
        if (2 < n_vertex_data_seeked_components) {
          bVar5 = true;
          if ((vertex_data_seeked[2] != vertex_data[uVar4 + 2]) ||
             (bVar1 = true, NAN(vertex_data_seeked[2]) || NAN(vertex_data[uVar4 + 2])))
          goto LAB_00d3ad2f;
        }
      }
    } while ((!bVar5) &&
            (bVar5 = (ulong)n_vertices * 3 - 3 != uVar2, uVar2 = uVar2 + 3, bVar3 = bVar1, bVar5));
  }
  return bVar1;
}

Assistant:

bool TessellationShaderInvarianceRule4Test::isVertexDefined(const float* vertex_data, unsigned int n_vertices,
															const float* vertex_data_seeked,
															unsigned int n_vertex_data_seeked_components)
{
	bool result = false;

	DE_ASSERT(n_vertex_data_seeked_components >= 2);

	for (unsigned int n_vertex = 0; n_vertex < n_vertices; ++n_vertex)
	{
		const float* current_vertex_data = vertex_data + 3 /* components */ * n_vertex;

		if ((vertex_data_seeked[0] == current_vertex_data[0]) && (vertex_data_seeked[1] == current_vertex_data[1]) &&
			((n_vertex_data_seeked_components < 3) ||
			 (n_vertex_data_seeked_components >= 3 && (vertex_data_seeked[2] == current_vertex_data[2]))))
		{
			result = true;

			break;
		} /* if (components match) */
	}	 /* for (all vertices) */

	return result;
}